

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O1

void __thiscall TSMuxer::addData(TSMuxer *this,uint8_t pesStreamID,int pid,AVPacket *avPacket)

{
  byte bVar1;
  size_t sVar2;
  pointer puVar3;
  pointer ppVar4;
  undefined4 *puVar5;
  pointer puVar6;
  int iVar7;
  int iVar8;
  int beforePesLen;
  ostringstream ss;
  int local_1bc;
  uint *local_1b8;
  undefined8 local_1b0;
  uint local_1a8;
  undefined4 uStack_1a4;
  undefined4 uStack_1a0;
  undefined4 uStack_19c;
  int local_198 [94];
  
  sVar2 = (this->m_pesData).m_size;
  local_1bc = (int)sVar2;
  if (sVar2 == 0) {
    buildPesHeader(this,pesStreamID,avPacket,(int)avPacket);
    this->m_pesPID = pid;
    bVar1 = (byte)avPacket->flags;
    this->m_pesIFrame = (bool)(bVar1 >> 3 & 1);
    this->m_pesSpsPps = (bool)(bVar1 >> 5 & 1);
  }
  iVar8 = (int)(this->m_pesData).m_size;
  if (iVar8 < 0x5f5e101) {
    iVar7 = iVar8 - local_1bc;
    MemoryBlock::grow(&this->m_pesData,(long)avPacket->size);
    puVar3 = (this->m_pesData).m_data.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar6 = (pointer)0x0;
    if (puVar3 != (this->m_pesData).m_data.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_finish) {
      puVar6 = puVar3;
    }
    memcpy(puVar6 + iVar8,avPacket->data,(long)avPacket->size);
    if ((avPacket->flags & 0x10) != 0) {
      ppVar4 = (this->m_priorityData).
               super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      if (((this->m_priorityData).
           super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start == ppVar4) ||
         (ppVar4[-1].first + ppVar4[-1].second != local_1bc)) {
        local_198[0] = iVar7 + avPacket->size;
        std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int>
                  ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)
                   &this->m_priorityData,&local_1bc,local_198);
      }
      else {
        ppVar4[-1].second = ppVar4[-1].second + iVar7 + avPacket->size;
      }
    }
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,
             "Pes packet len too large ( >100Mb). Bad stream or invalid codec speciffed.",0x4a);
  puVar5 = (undefined4 *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  *puVar5 = 3;
  *(undefined4 **)(puVar5 + 2) = puVar5 + 6;
  if (local_1b8 == &local_1a8) {
    puVar5[6] = local_1a8;
    puVar5[7] = uStack_1a4;
    puVar5[8] = uStack_1a0;
    puVar5[9] = uStack_19c;
  }
  else {
    *(uint **)(puVar5 + 2) = local_1b8;
    *(ulong *)(puVar5 + 6) = CONCAT44(uStack_1a4,local_1a8);
  }
  *(undefined8 *)(puVar5 + 4) = local_1b0;
  local_1b0 = 0;
  local_1a8 = local_1a8 & 0xffffff00;
  local_1b8 = &local_1a8;
  __cxa_throw(puVar5,&VodCoreException::typeinfo,VodCoreException::~VodCoreException);
}

Assistant:

void TSMuxer::addData(const uint8_t pesStreamID, const int pid, AVPacket& avPacket)
{
    int beforePesLen = static_cast<int>(m_pesData.size());
    if (m_pesData.size() == 0)
    {
        buildPesHeader(pesStreamID, avPacket, pid);
        m_pesPID = pid;
        m_pesIFrame = avPacket.flags & AVPacket::IS_IFRAME;
        m_pesSpsPps = avPacket.flags & AVPacket::IS_SPS_PPS_IN_GOP;
    }
    const int oldLen = static_cast<int>(m_pesData.size());
    const int pesHeaderLen = oldLen - beforePesLen;
    if (oldLen > 100000000)
        THROW(ERR_COMMON, "Pes packet len too large ( >100Mb). Bad stream or invalid codec speciffed.")
    m_pesData.grow(avPacket.size /*+ additionDataSize*/);
    uint8_t* dst = m_pesData.data() + oldLen;
    // memcpy(dst, tmpBuffer, additionDataSize);
    memcpy(dst /*+ additionDataSize*/, avPacket.data, avPacket.size);
    if (avPacket.flags & AVPacket::PRIORITY_DATA)
    {
        if (!m_priorityData.empty() && m_priorityData.rbegin()->first + m_priorityData.rbegin()->second == beforePesLen)
            m_priorityData.rbegin()->second += avPacket.size + pesHeaderLen;
        else
            m_priorityData.emplace_back(beforePesLen, avPacket.size + pesHeaderLen);
    }
}